

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateRecorder::Impl::remap_shader_module_handle
          (Impl *this,VkPipelineShaderStageCreateInfo *info)

{
  VkShaderModule *out_module;
  bool bVar1;
  VkPipelineShaderStageModuleIdentifierCreateInfoEXT *info_00;
  VkShaderModuleCreateInfo *pVVar2;
  VkShaderModule pVVar3;
  WorkItem record_item;
  
  if (this->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    info_00 = (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0;
  }
  else {
    info_00 = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>
                        ((VkStructureType)info->pNext,info);
  }
  out_module = &info->module;
  if (info->module == (VkShaderModule)0x0) {
    pVVar2 = find_pnext<VkShaderModuleCreateInfo>((VkStructureType)info->pNext,(void *)0x0);
    if (pVVar2 == (VkShaderModuleCreateInfo *)0x0) {
      if (info_00 == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
        return false;
      }
      record_item.type = VK_STRUCTURE_TYPE_APPLICATION_INFO;
      record_item._4_4_ = 0;
      bVar1 = get_hash_for_shader_module(this,info_00,(Hash *)&record_item);
      if (!bVar1) {
        return false;
      }
      *out_module = (VkShaderModule)record_item._0_8_;
      register_on_use(this,RESOURCE_SHADER_MODULE,record_item._0_8_);
      goto LAB_001232c1;
    }
    record_item.custom_hash = 0;
    record_item.type = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    record_item._4_4_ = 0;
    record_item.handle = 0;
    record_item.create_info = pVVar2;
    pVVar3 = (VkShaderModule)record_shader_module(this,&record_item,true);
    *out_module = pVVar3;
  }
  else {
    bVar1 = remap_shader_module_handle(this,info->module,out_module);
    if (!bVar1) {
      return false;
    }
  }
  if (info_00 == (VkPipelineShaderStageModuleIdentifierCreateInfoEXT *)0x0) {
    return true;
  }
LAB_001232c1:
  register_module_identifier(this,*out_module,info_00);
  return true;
}

Assistant:

bool StateRecorder::Impl::remap_shader_module_handle(VkPipelineShaderStageCreateInfo &info)
{
	const VkPipelineShaderStageModuleIdentifierCreateInfoEXT *identifier = nullptr;
	if (module_identifier_database_iface)
	{
		identifier = find_pnext<VkPipelineShaderStageModuleIdentifierCreateInfoEXT>(
				VK_STRUCTURE_TYPE_PIPELINE_SHADER_STAGE_MODULE_IDENTIFIER_CREATE_INFO_EXT, info.pNext);
	}

	if (info.module != VK_NULL_HANDLE)
	{
		if (!remap_shader_module_handle(info.module, &info.module))
			return false;
	}
	else if (const auto *module = find_pnext<VkShaderModuleCreateInfo>(
			VK_STRUCTURE_TYPE_SHADER_MODULE_CREATE_INFO, info.pNext))
	{
		WorkItem record_item = {};
		record_item.create_info = const_cast<VkShaderModuleCreateInfo *>(module);
		Hash h = record_shader_module(record_item, true);
		info.module = api_object_cast<VkShaderModule>(h);
	}
	else if (identifier)
	{
		Hash h = 0;
		if (!get_hash_for_shader_module(identifier, &h))
			return false;
		info.module = api_object_cast<VkShaderModule>(h);
		register_on_use(RESOURCE_SHADER_MODULE, h);
	}
	else
		return false;

	if (identifier)
		register_module_identifier(info.module, *identifier);

	return true;
}